

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack18_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0x3ffff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x12;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xf) << 0xe | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *puVar2 >> 4 & 0x3ffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0x16;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0xff) << 10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 8 & 0x3ffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0x1a;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0xfff) << 6 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0xc & 0x3ffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[4] & 0xffff) << 2 | *puVar1;
  *puVar1 = base + *puVar1;
  return in + 5;
}

Assistant:

uint32_t * unpack18_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 18 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 18 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 18 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 18 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 18 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 18 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 18 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 18 - 16 );
    *out += base;
    out++;

    return in + 1;
}